

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O1

void expels(monst *mtmp,permonst *mdat,boolean message)

{
  uchar uVar1;
  boolean bVar2;
  ulong uVar3;
  char *pcVar4;
  char blast [40];
  ulong local_38;
  undefined5 uStack_30;
  undefined2 uStack_2b;
  undefined1 uStack_29;
  undefined5 uStack_28;
  undefined2 uStack_23;
  
  if (message != '\0') {
    if ((mdat->mflags1 & 0x40000) == 0) {
      local_38 = local_38 & 0xffffffffffffff00;
      uVar3 = 0;
      do {
        if (mdat->mattk[uVar3].aatyp == '\v') goto LAB_001cb31b;
        uVar3 = uVar3 + 1;
      } while (uVar3 != 6);
      uVar3 = 6;
LAB_001cb31b:
      if (mdat == mons + 0x9f || mdat->mlet == '\x16') {
        uVar1 = mdat->mattk[uVar3 & 0xffffffff].adtyp;
        if (uVar1 == '\x03') {
          local_38._0_1_ = ' ';
          local_38._1_1_ = 'i';
          local_38._2_1_ = 'n';
          local_38._3_1_ = ' ';
          local_38._4_1_ = 'a';
          local_38._5_1_ = ' ';
          local_38._6_1_ = 'b';
          local_38._7_1_ = 'l';
          uStack_30 = 0x6f20747361;
          uStack_2b = 0x2066;
          uStack_29 = 0x66;
          uStack_28 = 0x74736f72;
        }
        else if (uVar1 == '\x06') {
          local_38._0_1_ = ' ';
          local_38._1_1_ = 'i';
          local_38._2_1_ = 'n';
          local_38._3_1_ = ' ';
          local_38._4_1_ = 'a';
          local_38._5_1_ = ' ';
          local_38._6_1_ = 's';
          local_38._7_1_ = 'h';
          uStack_30 = 0x207265776f;
          uStack_2b = 0x666f;
          uStack_29 = 0x20;
          uStack_28 = 0x6b72617073;
          uStack_23 = 0x73;
        }
      }
      else {
        local_38._0_1_ = ' ';
        local_38._1_1_ = 'w';
        local_38._2_1_ = 'i';
        local_38._3_1_ = 't';
        local_38._4_1_ = 'h';
        local_38._5_1_ = ' ';
        local_38._6_1_ = 'a';
        local_38._7_1_ = ' ';
        uStack_30 = 0x6c65757173;
        uStack_2b = 0x6863;
        uStack_29 = 0;
      }
      pcVar4 = mon_nam(mtmp);
      pline("You get expelled from %s%s!",pcVar4,&local_38);
    }
    else {
      pline("You get regurgitated!");
    }
  }
  unstuck(mtmp);
  mnexto(mtmp);
  newsym((int)u.ux,(int)u.uy);
  spoteffects('\x01');
  bVar2 = um_dist(mtmp->mx,mtmp->my,'\x01');
  if (bVar2 != '\0') {
    pline("Brrooaa...  You land hard at some distance.");
  }
  return;
}

Assistant:

void expels(struct monst *mtmp,
	    const struct permonst *mdat, /* if mtmp is polymorphed, mdat != mtmp->data */
	    boolean message)
{
	if (message) {
		if (is_animal(mdat))
			pline("You get regurgitated!");
		else {
			char blast[40];
			int i;

			blast[0] = '\0';
			for (i = 0; i < NATTK; i++)
				if (mdat->mattk[i].aatyp == AT_ENGL)
					break;
			if (i < NATTK && mdat->mattk[i].aatyp != AT_ENGL) {
			      warning("Swallower has no engulfing attack?");
			} else {
				if (is_whirly(mdat)) {
					switch (mdat->mattk[i].adtyp) {
						case AD_ELEC:
							strcpy(blast,
						      " in a shower of sparks");
							break;
						case AD_COLD:
							strcpy(blast,
							" in a blast of frost");
							break;
					}
				} else
					strcpy(blast, " with a squelch");
				pline("You get expelled from %s%s!",
				    mon_nam(mtmp), blast);
			}
		}
	}
	unstuck(mtmp);	/* ball&chain returned in unstuck() */
	mnexto(mtmp);
	newsym(u.ux,u.uy);
	spoteffects(TRUE);
	/* to cover for a case where mtmp is not in a next square */
	if (um_dist(mtmp->mx,mtmp->my,1))
		pline("Brrooaa...  You land hard at some distance.");
}